

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

void __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:81:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:86:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:91:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:107:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:122:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:127:9)>
::recreateMortonCodes
          (BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:81:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:86:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:91:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:107:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:122:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:127:9)>
           *this,range<unsigned_int> *current)

{
  BuildPrim *pBVar1;
  BuildPrim *pBVar2;
  Vec3fx *pVVar3;
  PrimRef *pPVar4;
  PrimRef *pPVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char cVar9;
  runtime_error *prVar10;
  ulong uVar11;
  uint uVar12;
  _func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *in_R9;
  size_t i;
  ulong uVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint uVar19;
  uint uVar22;
  uint uVar23;
  undefined1 in_XMM2 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM4 [16];
  anon_class_8_1_8991fb9c calculateCentBounds;
  MortonCodeMapping mapping;
  BBox3fa centBounds;
  task_group_context context;
  task_group_context *in_stack_fffffffffffffeb8;
  BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:81:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:86:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:91:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:107:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:122:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:127:9)>
  *local_140;
  BBox<embree::Vec3fa> local_138;
  anon_class_8_1_898bcfc2 local_110;
  blocked_range<unsigned_int> local_108;
  blocked_range<unsigned_int> local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  task_group_context local_b0;
  
  uVar19 = current->_begin;
  uVar13 = (ulong)uVar19;
  uVar22 = current->_end;
  if (uVar22 - uVar19 < 0x400) {
    auVar14 = _DAT_01feb9f0;
    auVar20 = _DAT_01feba00;
    if (uVar19 < uVar22) {
      pPVar4 = *this->calculateBounds->prims;
      uVar11 = uVar13;
      do {
        uVar12 = this->morton[uVar11].field_0.field_0.index;
        pPVar5 = pPVar4 + uVar12;
        pVVar3 = &pPVar4[uVar12].upper;
        fVar15 = (pPVar5->lower).field_0.m128[0] + (pVVar3->field_0).m128[0];
        fVar16 = (pPVar5->lower).field_0.m128[1] + (pVVar3->field_0).m128[1];
        fVar17 = (pPVar5->lower).field_0.m128[2] + (pVVar3->field_0).m128[2];
        fVar18 = (pPVar5->lower).field_0.m128[3] + (pVVar3->field_0).m128[3];
        auVar7._4_4_ = fVar16;
        auVar7._0_4_ = fVar15;
        auVar7._8_4_ = fVar17;
        auVar7._12_4_ = fVar18;
        auVar14 = minps(auVar14,auVar7);
        auVar8._4_4_ = fVar16;
        auVar8._0_4_ = fVar15;
        auVar8._8_4_ = fVar17;
        auVar8._12_4_ = fVar18;
        auVar20 = maxps(auVar20,auVar8);
        uVar11 = uVar11 + 1;
      } while (uVar22 != uVar11);
    }
    uVar11 = (ulong)current->_end;
    if (uVar19 < current->_end) {
      auVar21._0_4_ = auVar20._0_4_ - auVar14._0_4_;
      auVar21._4_4_ = auVar20._4_4_ - auVar14._4_4_;
      auVar21._8_4_ = auVar20._8_4_ - auVar14._8_4_;
      auVar21._12_4_ = auVar20._12_4_ - auVar14._12_4_;
      auVar20 = rcpps(in_XMM4,auVar21);
      fVar15 = auVar20._0_4_;
      fVar16 = auVar20._4_4_;
      fVar17 = auVar20._8_4_;
      do {
        pPVar5 = *this->calculateBounds->prims;
        uVar19 = this->morton[uVar13].field_0.field_0.index;
        pPVar4 = pPVar5 + uVar19;
        pVVar3 = &pPVar5[uVar19].upper;
        uVar19 = (uint)((((pPVar4->lower).field_0.m128[0] + (pVVar3->field_0).m128[0]) -
                        auVar14._0_4_) *
                       (float)((uint)(((1.0 - auVar21._0_4_ * fVar15) * fVar15 + fVar15) * 1013.76)
                              & -(uint)(1e-19 < auVar21._0_4_)));
        uVar22 = (uint)((((pPVar4->lower).field_0.m128[1] + (pVVar3->field_0).m128[1]) -
                        auVar14._4_4_) *
                       (float)((uint)(((1.0 - auVar21._4_4_ * fVar16) * fVar16 + fVar16) * 1013.76)
                              & -(uint)(1e-19 < auVar21._4_4_)));
        uVar23 = (uint)((((pPVar4->lower).field_0.m128[2] + (pVVar3->field_0).m128[2]) -
                        auVar14._8_4_) *
                       (float)((uint)(((1.0 - auVar21._8_4_ * fVar17) * fVar17 + fVar17) * 1013.76)
                              & -(uint)(1e-19 < auVar21._8_4_)));
        uVar19 = (uVar19 << 0x10 | uVar19) & 0x30000ff;
        uVar19 = (uVar19 << 8 | uVar19) & 0x300f00f;
        uVar22 = (uVar22 << 0x10 | uVar22) & 0x30000ff;
        uVar12 = (uVar22 << 8 | uVar22) & 0x300f00f;
        uVar22 = (uVar23 << 0x10 | uVar23) & 0x30000ff;
        uVar22 = (uVar22 << 8 | uVar22) & 0x300f00f;
        this->morton[uVar13].field_0.field_0.code =
             ((uVar22 << 4 | uVar22) & 0x30c30c3) * 0x14 & 0x24924924 |
             ((uVar12 << 4 | uVar12) & 0x30c30c3) * 10 & 0x12492492 |
             ((uVar19 << 4 | uVar19) & 0x30c30c3) * 5 & 0x9249249;
        uVar13 = uVar13 + 1;
        uVar11 = (ulong)current->_end;
      } while (uVar13 < uVar11);
    }
    uVar19 = current->_begin;
    if (uVar19 != (uint)uVar11) {
      pBVar1 = this->morton + uVar11;
      pBVar2 = this->morton + uVar19;
      uVar13 = (long)(uVar11 * 8 + (ulong)uVar19 * -8) >> 3;
      lVar6 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<embree::sse2::BVHBuilderMorton::BuildPrim*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1);
      return;
    }
  }
  else {
    local_f8.my_end = 0x7f800000;
    local_f8.my_begin = 0x7f800000;
    local_f8.my_grainsize = 0x7f8000007f800000;
    local_e8 = 0xff800000ff800000;
    uStack_e0 = 0xff800000ff800000;
    local_b0.my_version = proxy_support;
    local_b0.my_traits = (context_traits)0x4;
    local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_b0.my_name = CUSTOM_CTX;
    local_140 = this;
    tbb::detail::r1::initialize(&local_b0);
    local_108.my_begin = uVar19;
    local_108.my_end = uVar22;
    local_108.my_grainsize = 0x400;
    local_138.lower.field_0._0_8_ = BBox<embree::Vec3fa>::merge;
    local_138.lower.field_0._8_8_ = &local_140;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_int>,embree::BBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_int,embree::BBox<embree::Vec3fa>,embree::sse2::BVHBuilderMorton::BuilderT<std::pair<void*,embree::BBox<embree::Vec3fa>>,embree::FastAllocator::CachedAllocator,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__2,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__3,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__4,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__5,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__6,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__7>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>(unsigned_int,unsigned_int,unsigned_int,embree::BBox<embree::Vec3fa>const&,embree::sse2::BVHBuilderMorton::BuilderT<std::pair<void*,embree::BBox<embree::Vec3fa>>,embree::FastAllocator::CachedAllocator,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__2,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__3,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__4,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__5,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__6,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__7>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_const&,embree::BBox<embree::Vec3fa>const(const&)(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&,embree::BBox<embree::Vec3fa>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>
              ((BBox<embree::Vec3fa> *)&local_d8.field_1,(d1 *)&local_108,&local_f8,&local_138,
               (anon_class_16_2_ed117de8_conflict *)&local_b0,in_R9,in_stack_fffffffffffffeb8);
    cVar9 = tbb::detail::r1::is_group_execution_cancelled(&local_b0);
    if (cVar9 != '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"task cancelled");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_b0);
    local_c8 = local_c8 - local_d8.m128[0];
    fStack_c4 = fStack_c4 - local_d8.m128[1];
    fStack_c0 = fStack_c0 - local_d8.m128[2];
    fStack_bc = fStack_bc - local_d8.m128[3];
    auVar14._4_4_ = fStack_c4;
    auVar14._0_4_ = local_c8;
    auVar14._8_4_ = fStack_c0;
    auVar14._12_4_ = fStack_bc;
    auVar14 = rcpps(in_XMM2,auVar14);
    fVar15 = auVar14._0_4_;
    fVar16 = auVar14._4_4_;
    fVar17 = auVar14._8_4_;
    fVar18 = auVar14._12_4_;
    local_e8 = CONCAT44((uint)(((1.0 - fStack_c4 * fVar16) * fVar16 + fVar16) * 1013.76) &
                        -(uint)(1e-19 < fStack_c4),
                        (uint)(((1.0 - local_c8 * fVar15) * fVar15 + fVar15) * 1013.76) &
                        -(uint)(1e-19 < local_c8));
    uStack_e0 = CONCAT44((uint)(((1.0 - fStack_bc * fVar18) * fVar18 + fVar18) * 1013.76) &
                         -(uint)(1e-19 < fStack_bc),
                         (uint)(((1.0 - fStack_c0 * fVar17) * fVar17 + fVar17) * 1013.76) &
                         -(uint)(1e-19 < fStack_c0));
    local_b0.my_version = proxy_support;
    local_b0.my_traits = (context_traits)0x4;
    local_b0.my_node = (intrusive_list_node)ZEXT816(0);
    local_b0.my_name = CUSTOM_CTX;
    local_138.upper.field_0._0_8_ = *current;
    local_138.upper.field_0._8_8_ = 0;
    local_138.lower.field_0._0_8_ = this;
    local_138.lower.field_0._8_8_ = &local_f8;
    tbb::detail::r1::initialize(&local_b0);
    local_108.my_begin = (uint)local_138.upper.field_0.m128[0];
    local_108.my_end = (uint)local_138.upper.field_0.m128[1];
    local_108.my_grainsize = 0x400;
    local_110.func = (anon_class_16_2_00173b7b *)&local_138;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_int>,embree::parallel_for<unsigned_int,embree::sse2::BVHBuilderMorton::BuilderT<std::pair<void*,embree::BBox<embree::Vec3fa>>,embree::FastAllocator::CachedAllocator,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__2,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__3,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__4,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__5,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__6,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__7>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_>(unsigned_int,unsigned_int,unsigned_int,embree::sse2::BVHBuilderMorton::BuilderT<std::pair<void*,embree::BBox<embree::Vec3fa>>,embree::FastAllocator::CachedAllocator,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__2,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__3,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__4,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__5,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__6,embree::sse2::rtcBuildBVHMorton(RTCBuildArguments_const*)::__7>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&)_1_>
              (&local_108,&local_110,&local_b0);
    cVar9 = tbb::detail::r1::is_group_execution_cancelled(&local_b0);
    if (cVar9 != '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"task cancelled");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_b0);
    tbb::detail::d1::
    parallel_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,std::less<embree::sse2::BVHBuilderMorton::BuildPrim>>
              (this->morton + current->_begin,this->morton + current->_end,
               (less<embree::sse2::BVHBuilderMorton::BuildPrim> *)&local_b0);
  }
  return;
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }